

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

void __thiscall
cfd::core::AbstractTransaction::SetScriptWitnessStack
          (AbstractTransaction *this,uint32_t tx_in_index,uint32_t witness_index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  void *pvVar1;
  wally_tx_witness_stack *stack;
  uchar *witness;
  CfdException *this_00;
  uchar *witness_len;
  undefined4 in_register_00000034;
  allocator local_6d;
  int ret;
  undefined1 local_68 [32];
  string function_name;
  
  (*this->_vptr_AbstractTransaction[0xb])
            (this,CONCAT44(in_register_00000034,tx_in_index),0x1e9,"SetScriptWitnessStack");
  pvVar1 = this->wally_tx_pointer_;
  if (*(ulong *)((long)pvVar1 + 0x10) <= (ulong)tx_in_index) {
    return;
  }
  ret = -2;
  ::std::__cxx11::string::string
            ((string *)&function_name,"wally witness is NULL.",(allocator *)local_68);
  stack = *(wally_tx_witness_stack **)
           (*(long *)((long)pvVar1 + 8) + 0x38 + (ulong)tx_in_index * 0xd0);
  if (stack != (wally_tx_witness_stack *)0x0) {
    ::std::__cxx11::string::assign((char *)&function_name);
    witness = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    witness_len = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish + -(long)witness;
    if (witness_len == (uchar *)0x0) {
      witness_len = (uchar *)0x0;
      witness = (uchar *)0x0;
    }
    ret = wally_tx_witness_stack_set(stack,(ulong)witness_index,witness,(size_t)witness_len);
    if (ret == 0) {
      ::std::__cxx11::string::~string((string *)&function_name);
      return;
    }
  }
  local_68._0_8_ = "cfdcore_transaction_common.cpp";
  local_68._8_4_ = 0x201;
  local_68._16_8_ = "SetScriptWitnessStack";
  logger::warn<std::__cxx11::string&,int&>
            ((CfdSourceLocation *)local_68,"{} NG[{}].",&function_name,&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_68,"witness stack set error.",&local_6d);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_68);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void AbstractTransaction::SetScriptWitnessStack(
    uint32_t tx_in_index, uint32_t witness_index,
    const std::vector<uint8_t> &data) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    int ret = WALLY_EINVAL;
    struct wally_tx_witness_stack *stack_pointer = NULL;

    std::string function_name = "wally witness is NULL.";
    if (tx_pointer->inputs[tx_in_index].witness != NULL) {
      stack_pointer = tx_pointer->inputs[tx_in_index].witness;

      // append witness stack
      function_name = "wally_tx_witness_stack_set";
      if (data.empty()) {
        ret =
            wally_tx_witness_stack_set(stack_pointer, witness_index, NULL, 0);
      } else {
        ret = wally_tx_witness_stack_set(
            stack_pointer, witness_index, data.data(), data.size());
      }
    }

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "{} NG[{}].", function_name, ret);
      throw CfdException(kCfdIllegalStateError, "witness stack set error.");
    }
  }
}